

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O3

void __thiscall FGLRenderer::EndDrawScene(FGLRenderer *this,sector_t *viewsector)

{
  bool bVar1;
  
  gl_RenderState.mFogEnabled = false;
  bVar1 = gl_IsHUDModelForPlayerAvailable
                    (*(player_t **)((&DAT_00a60408)[(long)consoleplayer * 0x54] + 0x200));
  if (bVar1) {
    (*_ptrc_glClear)(0x100);
    DrawPlayerSprites(this,viewsector,true);
    (*_ptrc_glDisable)(0xb90);
    (**(code **)((long)(this->framebuffer->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.
                       super_DCanvas.super_DObject._vptr_DObject + 0x128))(this->framebuffer,0);
    (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                        (this->mScreenViewport).width,(this->mScreenViewport).height);
  }
  else {
    (*_ptrc_glDisable)(0xb90);
    (**(code **)((long)(this->framebuffer->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.
                       super_DCanvas.super_DObject._vptr_DObject + 0x128))(this->framebuffer,0);
    (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                        (this->mScreenViewport).width,(this->mScreenViewport).height);
    DrawPlayerSprites(this,viewsector,false);
  }
  if (gl.legacyMode == true) {
    FRenderState::DrawColormapOverlay(&gl_RenderState);
  }
  gl_RenderState.mColormapState = 0;
  gl_RenderState.mLightParms[3] = *(float *)(&DAT_0074de28 + (ulong)(glset.lightmode == '\b') * 4);
  DrawTargeterSprites(this);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (!bVar1) {
    DrawBlend(this,viewsector);
  }
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x302;
    gl_RenderState.mDstBlend = 0x303;
  }
  else {
    (*_ptrc_glBlendFunc)(0x302,0x303);
  }
  gl_RenderState.mColor.vec[0] = 1.0;
  gl_RenderState.mColor.vec[1] = 1.0;
  gl_RenderState.mColor.vec[2] = 1.0;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  gl_RenderState.mTextureEnabled = true;
  (*_ptrc_glDisable)(0xc11);
  return;
}

Assistant:

void FGLRenderer::EndDrawScene(sector_t * viewsector)
{
	gl_RenderState.EnableFog(false);

	// [BB] HUD models need to be rendered here. Make sure that
	// DrawPlayerSprites is only called once. Either to draw
	// HUD models or to draw the weapon sprites.
	const bool renderHUDModel = gl_IsHUDModelForPlayerAvailable( players[consoleplayer].camera->player );
	if ( renderHUDModel )
	{
		// [BB] The HUD model should be drawn over everything else already drawn.
		glClear(GL_DEPTH_BUFFER_BIT);
		DrawPlayerSprites (viewsector, true);
	}

	glDisable(GL_STENCIL_TEST);

	framebuffer->Begin2D(false);

	Reset3DViewport();
	// [BB] Only draw the sprites if we didn't render a HUD model before.
	if ( renderHUDModel == false )
	{
		DrawPlayerSprites (viewsector, false);
	}
	if (gl.legacyMode)
	{
		gl_RenderState.DrawColormapOverlay();
	}

	gl_RenderState.SetFixedColormap(CM_DEFAULT);
	gl_RenderState.SetSoftLightLevel(-1);
	DrawTargeterSprites();
	if (!FGLRenderBuffers::IsEnabled())
	{
		DrawBlend(viewsector);
	}

	// Restore standard rendering state
	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
	glDisable(GL_SCISSOR_TEST);
}